

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_set.cc
# Opt level: O3

void __thiscall sfm::FeatureSet::clear_descriptors(FeatureSet *this)

{
  pointer pDVar1;
  pointer pDVar2;
  
  pDVar1 = (this->sift_descriptors).
           super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->sift_descriptors).
      super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
      _M_impl.super__Vector_impl_data._M_finish != pDVar1) {
    (this->sift_descriptors).
    super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
    _M_impl.super__Vector_impl_data._M_finish = pDVar1;
  }
  if ((this->sift_descriptors).
      super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != pDVar1) {
    std::
    __shrink_to_fit_aux<std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>,_true>
    ::_S_do_it(&this->sift_descriptors);
  }
  pDVar2 = (this->surf_descriptors).
           super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->surf_descriptors).
      super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
      _M_impl.super__Vector_impl_data._M_finish != pDVar2) {
    (this->surf_descriptors).
    super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
    _M_impl.super__Vector_impl_data._M_finish = pDVar2;
  }
  if ((this->surf_descriptors).
      super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != pDVar2) {
    std::
    __shrink_to_fit_aux<std::vector<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>,_true>
    ::_S_do_it(&this->surf_descriptors);
    return;
  }
  return;
}

Assistant:

void
FeatureSet::clear_descriptors (void)
{
    this->sift_descriptors.clear();
    this->sift_descriptors.shrink_to_fit();
    this->surf_descriptors.clear();
    this->surf_descriptors.shrink_to_fit();
}